

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

bool __thiscall
QPDF::CopiedStreamDataProvider::provideStreamData
          (CopiedStreamDataProvider *this,QPDFObjGen *og,Pipeline *pipeline,bool suppress_warnings,
          bool will_retry)

{
  QPDF *this_00;
  byte bVar1;
  mapped_type *pmVar2;
  element_type *peVar3;
  mapped_type *pmVar4;
  undefined1 local_70 [8];
  mapped_type foreign_stream;
  shared_ptr<QPDF::ForeignStreamData> local_50;
  byte local_39;
  undefined1 local_38 [7];
  bool result;
  shared_ptr<QPDF::ForeignStreamData> foreign_data;
  bool will_retry_local;
  bool suppress_warnings_local;
  Pipeline *pipeline_local;
  QPDFObjGen *og_local;
  CopiedStreamDataProvider *this_local;
  
  foreign_data.super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._6_1_ = will_retry;
  foreign_data.super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = suppress_warnings;
  pmVar2 = std::
           map<QPDFObjGen,_std::shared_ptr<QPDF::ForeignStreamData>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::shared_ptr<QPDF::ForeignStreamData>_>_>_>
           ::operator[](&this->foreign_stream_data,og);
  std::shared_ptr<QPDF::ForeignStreamData>::shared_ptr
            ((shared_ptr<QPDF::ForeignStreamData> *)local_38,pmVar2);
  local_39 = 0;
  peVar3 = std::__shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2> *)local_38)
  ;
  if (peVar3 == (element_type *)0x0) {
    pmVar4 = std::
             map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
             ::operator[](&this->foreign_streams,og);
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_70,pmVar4);
    local_39 = QPDFObjectHandle::pipeStreamData
                         ((QPDFObjectHandle *)local_70,pipeline,(bool *)0x0,0,qpdf_dl_none,
                          (bool)(foreign_data.
                                 super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._7_1_ & 1),
                          (bool)(foreign_data.
                                 super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._6_1_ & 1));
    QTC::TC("qpdf","QPDF copy foreign with foreign_stream",(byte)~local_39 & 1);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_70);
  }
  else {
    this_00 = this->destination_qpdf;
    std::shared_ptr<QPDF::ForeignStreamData>::shared_ptr
              (&local_50,(shared_ptr<QPDF::ForeignStreamData> *)local_38);
    local_39 = pipeForeignStreamData
                         (this_00,&local_50,pipeline,
                          (bool)(foreign_data.
                                 super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._7_1_ & 1),
                          (bool)(foreign_data.
                                 super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._6_1_ & 1));
    std::shared_ptr<QPDF::ForeignStreamData>::~shared_ptr(&local_50);
    QTC::TC("qpdf","QPDF copy foreign with data",(byte)~local_39 & 1);
  }
  bVar1 = local_39;
  std::shared_ptr<QPDF::ForeignStreamData>::~shared_ptr
            ((shared_ptr<QPDF::ForeignStreamData> *)local_38);
  return (bool)(bVar1 & 1);
}

Assistant:

bool
QPDF::CopiedStreamDataProvider::provideStreamData(
    QPDFObjGen const& og, Pipeline* pipeline, bool suppress_warnings, bool will_retry)
{
    std::shared_ptr<ForeignStreamData> foreign_data = foreign_stream_data[og];
    bool result = false;
    if (foreign_data.get()) {
        result = destination_qpdf.pipeForeignStreamData(
            foreign_data, pipeline, suppress_warnings, will_retry);
        QTC::TC("qpdf", "QPDF copy foreign with data", result ? 0 : 1);
    } else {
        auto foreign_stream = foreign_streams[og];
        result = foreign_stream.pipeStreamData(
            pipeline, nullptr, 0, qpdf_dl_none, suppress_warnings, will_retry);
        QTC::TC("qpdf", "QPDF copy foreign with foreign_stream", result ? 0 : 1);
    }
    return result;
}